

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O1

char mctools_drive_letter(mcu8str *rawpath)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  
  pcVar3 = rawpath->c_str;
  uVar2 = rawpath->size;
  iVar5 = mctools_impl_has_winnamespace(rawpath);
  uVar7 = uVar2 - 4;
  if (iVar5 == 0) {
    uVar7 = uVar2;
  }
  if ((uVar7 < 2) || (lVar6 = (ulong)(iVar5 != 0) * 4, pcVar3[lVar6 + 1] != ':')) {
    cVar4 = '\0';
  }
  else {
    cVar1 = pcVar3[lVar6];
    cVar4 = cVar1;
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      cVar4 = cVar1 + -0x20;
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        cVar4 = '\0';
      }
    }
  }
  return cVar4;
}

Assistant:

char mctools_drive_letter( const mcu8str* rawpath )
  {
    mcu8str path = mctools_impl_view_no_winnamespace(rawpath);
    if ( path.size < 2 )
      return 0;
    if ( path.c_str[1] != ':' )
      return 0;
    if ( path.c_str[0] >= 'A' && path.c_str[0] <= 'Z' )
      return path.c_str[0];
    if ( path.c_str[0] >= 'a' && path.c_str[0] <= 'z' )
      return (char)(path.c_str[0] - 32);//uppercase
    return 0;
  }